

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O3

void __thiscall Catch::ConsoleReporter::noMatchingTestCases(ConsoleReporter *this,string *spec)

{
  ostream *poVar1;
  
  poVar1 = (ostream *)(this->super_StreamingReporterBase).stream;
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"No test cases matched \'",0x17);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar1,(spec->_M_dataplus)._M_p,spec->_M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\'",1);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  std::ostream::flush();
  return;
}

Assistant:

virtual void noMatchingTestCases( std::string const& spec ) {
            stream << "No test cases matched '" << spec << "'" << std::endl;
        }